

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_alloc.c
# Opt level: O3

void kmpc_free(void *ptr)

{
  kmp_info_t *th;
  kmp_info_t **ppkVar1;
  int iVar2;
  void *buf;
  
  ppkVar1 = __kmp_threads;
  if ((ptr != (void *)0x0) && (__kmp_init_serial != 0)) {
    iVar2 = __kmp_get_global_thread_id();
    th = ppkVar1[iVar2];
    __kmp_bget_dequeue(th);
    buf = *(void **)((long)ptr + -8);
    if (buf == (void *)0x0) {
      __kmp_debug_assert("assertion failure",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-openmp-runtime/src/kmp_alloc.c"
                         ,0x600);
      buf = *(void **)((long)ptr + -8);
    }
    brel(th,buf);
    return;
  }
  return;
}

Assistant:

void
kmpc_free( void * ptr )
{
    if ( ! __kmp_init_serial ) {
        return;
    }; // if
    if ( ptr != NULL ) {
        kmp_info_t *th = __kmp_get_thread();
        __kmp_bget_dequeue( th );         /* Release any queued buffers */
        // extract allocated pointer and free it
        KMP_ASSERT(*((void**)ptr - 1));
        brel( th, *((void**)ptr - 1) );
    };
}